

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O3

int __thiscall
tetgenmesh::scoutcrossedge
          (tetgenmesh *this,triface *crosstet,arraypool *missingshbds,arraypool *missingshs)

{
  tetrahedron *pppdVar1;
  int iVar2;
  int iVar3;
  shellface *pppdVar4;
  shellface ppdVar5;
  shellface pb;
  shellface pc;
  char *pcVar6;
  long lVar7;
  point A;
  point B;
  memorypool *pmVar8;
  bool bVar9;
  undefined8 uVar10;
  bool bVar11;
  uint uVar12;
  interresult iVar13;
  int iVar14;
  uint uVar15;
  long *plVar17;
  long lVar18;
  tetrahedron *pppdVar19;
  tetrahedron *pppdVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  tetrahedron ppdVar24;
  ulong uVar25;
  int iVar26;
  double *pdVar27;
  undefined8 *puVar28;
  ulong uVar29;
  double dVar30;
  triface local_a8;
  long local_90;
  tetrahedron local_88;
  double *local_80;
  int types [2];
  face local_58;
  int poss [4];
  ulong uVar16;
  
  if (0 < missingshbds->objects) {
    lVar23 = 0;
    do {
      local_88 = (tetrahedron)
                 missingshbds->toparray
                 [(uint)lVar23 >> ((byte)missingshbds->log2objectsperblock & 0x1f)];
      local_90 = (long)missingshbds->objectbytes *
                 (long)(int)(missingshbds->objectsperblockmark & (uint)lVar23);
      uVar25 = *(ulong *)((*(ulong *)(*(long *)((long)local_88 + local_90) + 0x30 +
                                     (long)(*(int *)((long)local_88 + local_90 + 8) >> 1) * 8) &
                          0xfffffffffffffff8) + 0x48);
      uVar12 = (uint)uVar25 & 0xf;
      uVar16 = (ulong)uVar12;
      uVar25 = uVar25 & 0xfffffffffffffff0;
      uVar29 = uVar25;
      if (*(long *)(uVar25 + (long)orgpivot[uVar12] * 8) !=
          *(long *)(*(long *)((long)local_88 + local_90) +
                   (long)sorgpivot[*(int *)((long)local_88 + local_90 + 8)] * 8)) {
        uVar16 = (ulong)(uint)esymtbl[uVar16];
      }
      do {
        pdVar27 = (double *)(long)(int)uVar16;
        if ((*(byte *)(*(long *)(uVar29 + (long)apexpivot[(long)pdVar27] * 8) + 4 +
                      (long)this->pointmarkindex * 4) & 2) != 0) {
          pppdVar4 = *(shellface **)((long)local_88 + local_90);
          bVar11 = true;
          do {
            bVar9 = bVar11;
            uVar12 = enexttbl[(int)uVar16];
            uVar16 = (ulong)uVar12;
            if (*(long *)(uVar29 + 0x40) == 0) {
LAB_0012d04a:
              uVar15 = snextpivot[*(int *)((long)local_88 + local_90 + 8)];
LAB_0012d07c:
              ppdVar5 = pppdVar4[sorgpivot[(int)uVar15]];
              pb = pppdVar4[sdestpivot[(int)uVar15]];
              pc = pppdVar4[sapexpivot[(int)uVar15]];
              local_80 = pdVar27;
              local_58.sh = pppdVar4;
              local_58.shver = uVar15;
              calculateabovepoint4
                        (this,(point)ppdVar5,(point)pb,(point)pc,
                         *(point *)(uVar29 + (long)destpivot[(int)uVar12] * 8));
              dVar30 = orient3d((double *)ppdVar5,(double *)pb,(double *)pc,this->dummypoint);
              if (dVar30 <= 0.0) {
                if ((dVar30 == 0.0) && (!NAN(dVar30))) {
                  puts("Please report this bug to Hang.Si@wias-berlin.de. Include");
                  puts("  the message above, your input data set, and the exact");
                  puts("  command line you used to run this program, thank you.");
                  exit(2);
                }
              }
              else {
                local_58.shver = snextpivot[(int)(uVar15 ^ 1)];
              }
              iVar13 = sscoutsegment(this,&local_58,
                                     *(point *)(uVar29 + (long)destpivot[(int)uVar12] * 8),0,0,1);
              pdVar27 = local_80;
              if (iVar13 == SHAREEDGE) {
                poss[0] = 0;
                poss[1] = 0;
                poss[2] = 0;
                makeshellface(this,this->subsegs,(face *)poss);
                iVar14 = poss[2];
                uVar10 = poss._0_8_;
                local_58.sh[(long)(local_58.shver >> 1) + 6] =
                     (shellface)((long)poss[2] | poss._0_8_);
                *(ulong *)poss._0_8_ = (long)local_58.shver | (ulong)local_58.sh;
                ppdVar5 = local_58.sh[local_58.shver >> 1];
                *(shellface *)
                 (((ulong)ppdVar5 & 0xfffffffffffffff8) + 0x30 + (ulong)((uint)ppdVar5 & 6) * 4) =
                     (shellface)((long)poss[2] | poss._0_8_);
                *(shellface *)poss._0_8_ = ppdVar5;
                lawsonflip(this);
                uVar25 = *(ulong *)(uVar10 + (long)(iVar14 >> 1) * 8);
                uVar29 = uVar25 & 0xfffffffffffffff8;
                uVar25 = (ulong)((uint)uVar25 & 6);
                *(undefined8 *)(uVar29 + 0x30 + uVar25 * 4) = 0;
                uVar25 = *(ulong *)(uVar29 + uVar25 * 4);
                *(undefined8 *)
                 ((uVar25 & 0xfffffffffffffff8) + 0x30 + (ulong)((uint)uVar25 & 6) * 4) = 0;
                pmVar8 = this->subsegs;
                *(undefined8 *)(uVar10 + 0x18) = 0;
                *(void **)uVar10 = pmVar8->deaditemstack;
                pmVar8->deaditemstack = (void *)uVar10;
                pmVar8->items = pmVar8->items + -1;
                lVar23 = missingshs->objects;
                if (0 < lVar23) {
                  iVar14 = missingshs->log2objectsperblock;
                  uVar12 = missingshs->objectsperblockmark;
                  iVar2 = missingshs->objectbytes;
                  lVar18 = 0;
                  do {
                    plVar17 = (long *)((long)(missingshs->toparray
                                              [(uint)lVar18 >> ((byte)iVar14 & 0x1f)] +
                                             (long)(int)((uint)lVar18 & uVar12) * (long)iVar2) + 8);
                    lVar7 = *(long *)(missingshs->toparray[(uint)lVar18 >> ((byte)iVar14 & 0x1f)] +
                                     (long)(int)((uint)lVar18 & uVar12) * (long)iVar2);
                    iVar3 = this->shmarkindex;
                    iVar26 = 0;
                    do {
                      lVar21 = *plVar17;
                      lVar22 = (long)((int)lVar21 >> 1);
                      uVar25 = *(ulong *)(lVar7 + 0x30 + lVar22 * 8);
                      if ((uVar25 != 0) &&
                         (puVar28 = (undefined8 *)(uVar25 & 0xfffffffffffffff8),
                         (*(byte *)((long)puVar28 + (long)iVar3 * 4 + 4) & 1) != 0)) {
                        uVar15 = (uint)puVar28[9] & 0xf;
                        uVar29 = puVar28[9] & 0xfffffffffffffff0;
                        uVar25 = uVar29;
                        do {
                          if (*(long *)(uVar25 + 0x40) != 0) {
                            *(undefined8 *)
                             (*(long *)(uVar25 + 0x40) + (long)ver2edge[(int)uVar15] * 8) = 0;
                          }
                          uVar16 = *(ulong *)(uVar25 + (long)facepivot1[(int)uVar15] * 8);
                          uVar25 = uVar16 & 0xfffffffffffffff0;
                          uVar15 = facepivot2[(int)uVar15][(uint)uVar16 & 0xf];
                        } while (uVar25 != uVar29);
                        pmVar8 = this->subsegs;
                        puVar28[3] = 0;
                        *puVar28 = pmVar8->deaditemstack;
                        pmVar8->deaditemstack = puVar28;
                        pmVar8->items = pmVar8->items + -1;
                        *(undefined8 *)(lVar7 + 0x30 + lVar22 * 8) = 0;
                      }
                      plVar17 = (long *)(snextpivot + (int)lVar21);
                      iVar26 = iVar26 + 1;
                    } while (iVar26 != 3);
                    lVar18 = lVar18 + 1;
                  } while (lVar18 != lVar23);
                }
                this->fillregioncount = this->fillregioncount + 1;
                return 0;
              }
              if (this->flipstack != (badface *)0x0) {
                lawsonflip(this);
              }
              break;
            }
            if (*(long *)(*(long *)(uVar29 + 0x40) + (long)ver2edge[(int)uVar12] * 8) == 0) {
              if (bVar9) goto LAB_0012d04a;
              uVar15 = snextpivot[snextpivot[*(int *)((long)local_88 + local_90 + 8)]] ^ 1;
              uVar12 = esymtbl[(int)uVar12];
              goto LAB_0012d07c;
            }
            bVar11 = false;
          } while (bVar9);
        }
        uVar16 = *(ulong *)(uVar29 + (long)facepivot1[(long)pdVar27] * 8);
        uVar29 = uVar16 & 0xfffffffffffffff0;
        uVar16 = (ulong)(uint)facepivot2[(long)pdVar27][(uint)uVar16 & 0xf];
      } while (uVar29 != uVar25);
      lVar23 = lVar23 + 1;
    } while (lVar23 < missingshbds->objects);
    if (0 < missingshbds->objects) {
      lVar23 = 0;
      do {
        lVar18 = (long)missingshbds->objectbytes *
                 (long)(int)(missingshbds->objectsperblockmark & (uint)lVar23);
        uVar25 = *(ulong *)((*(ulong *)(*(long *)(missingshbds->toparray
                                                  [(uint)lVar23 >>
                                                   ((byte)missingshbds->log2objectsperblock & 0x1f)]
                                                 + lVar18) + 0x30 +
                                       (long)(*(int *)(missingshbds->toparray
                                                       [(uint)lVar23 >>
                                                        ((byte)missingshbds->log2objectsperblock &
                                                        0x1f)] + lVar18 + 8) >> 1) * 8) &
                            0xfffffffffffffff8) + 0x48);
        uVar12 = (uint)uVar25 & 0xf;
        pppdVar19 = (tetrahedron *)(uVar25 & 0xfffffffffffffff0);
        pppdVar20 = pppdVar19;
        do {
          local_90 = (long)(int)uVar12;
          local_88 = pppdVar20[apexpivot[local_90]];
          if ((((local_88 != (tetrahedron)this->dummypoint) &&
               (ppdVar24 = pppdVar20[oppopivot[local_90]], ppdVar24 != (tetrahedron)this->dummypoint
               )) && ((*(byte *)((long)local_88 + (long)this->pointmarkindex * 4 + 4) & 2) == 0)) &&
             (((*(byte *)((long)ppdVar24 + (long)this->pointmarkindex * 4 + 4) & 2) == 0 &&
              (0 < missingshs->objects)))) {
            lVar18 = 0;
            do {
              pcVar6 = missingshs->toparray
                       [(uint)lVar18 >> ((byte)missingshs->log2objectsperblock & 0x1f)];
              lVar21 = (long)missingshs->objectbytes *
                       (long)(int)(missingshs->objectsperblockmark & (uint)lVar18);
              lVar7 = *(long *)(pcVar6 + lVar21);
              iVar14 = *(int *)(pcVar6 + lVar21 + 8);
              A = *(point *)(lVar7 + (long)sorgpivot[iVar14] * 8);
              B = *(point *)(lVar7 + (long)sdestpivot[iVar14] * 8);
              local_80 = *(double **)(lVar7 + (long)sapexpivot[iVar14] * 8);
              iVar14 = tri_edge_test(this,A,B,local_80,(point)local_88,(point)ppdVar24,(point)0x0,1,
                                     types,poss);
              if (iVar14 != 0) {
                if (iVar14 != 2) goto LAB_0012d3ed;
                if ((types[0] & 0xfffffffeU) != 8) goto LAB_0012d7b4;
                crosstet->tet = pppdVar20;
                iVar14 = edestoppotbl[local_90];
                crosstet->ver = iVar14;
                if ((pppdVar20[8] != (tetrahedron)0x0) &&
                   (pppdVar20[8][ver2edge[iVar14]] != (double *)0x0)) goto LAB_0012d7b4;
                local_a8.tet = crosstet->tet;
                local_a8.ver = crosstet->ver;
                local_a8._12_4_ = *(undefined4 *)&crosstet->field_0xc;
                goto LAB_0012d6a1;
              }
              lVar18 = lVar18 + 1;
            } while (lVar18 < missingshs->objects);
          }
          pppdVar1 = pppdVar20 + facepivot1[local_90];
          pppdVar20 = (tetrahedron *)((ulong)*pppdVar1 & 0xfffffffffffffff0);
          uVar12 = facepivot2[local_90][(uint)*pppdVar1 & 0xf];
        } while (pppdVar20 != pppdVar19);
LAB_0012d3ed:
        lVar23 = lVar23 + 1;
        if (missingshbds->objects <= lVar23) {
          return 0;
        }
      } while( true );
    }
  }
  return 0;
  while( true ) {
    pppdVar19 = local_a8.tet + (local_a8.ver & 3U);
    local_a8.tet = (tetrahedron *)((ulong)*pppdVar19 & 0xfffffffffffffff0);
    local_a8.ver = fsymtbl[local_a8.ver][(uint)*pppdVar19 & 0xf];
    if (pppdVar20 == local_a8.tet) break;
LAB_0012d6a1:
    ppdVar24 = local_a8.tet[9];
    if ((ppdVar24 != (tetrahedron)0x0) && (ppdVar24[local_a8.ver & 3U] != (double *)0x0))
    goto LAB_0012d6f6;
  }
  ppdVar24 = local_a8.tet[9];
  if (ppdVar24 != (tetrahedron)0x0) {
LAB_0012d6f6:
    if (ppdVar24[local_a8.ver & 3] != (double *)0x0) {
      crosstet = &local_a8;
LAB_0012d7b4:
      report_selfint_face(this,A,B,local_80,(face *)(pcVar6 + lVar21),crosstet,2,types,poss);
    }
  }
  dVar30 = orient3d(A,B,local_80,(double *)local_88);
  if (dVar30 < 0.0) {
    crosstet->ver = esymtbl[crosstet->ver];
  }
  return 1;
}

Assistant:

int tetgenmesh::scoutcrossedge(triface& crosstet, arraypool* missingshbds, 
                               arraypool* missingshs)
{
  triface searchtet, spintet, neightet;
  face oldsh, searchsh, *parysh;
  face neighseg;
  point pa, pb, pc, pd, pe;
  REAL ori;
  int types[2], poss[4];
  int searchflag, interflag;
  int t1ver;
  int i, j;

  searchflag = 0;

  // Search the first new subface to fill the region.
  for (i = 0; i < missingshbds->objects && !searchflag; i++) {
    parysh = (face *) fastlookup(missingshbds, i);
    sspivot(*parysh, neighseg);
    sstpivot1(neighseg, searchtet);
    if (org(searchtet) != sorg(*parysh)) {
      esymself(searchtet);
    }
    spintet = searchtet;
    while (1) {
      if (pmarktested(apex(spintet))) {
        // A possible interior face.
        neightet = spintet;
        oldsh = *parysh;
		// Try to recover an interior edge.
		for (j = 0; j < 2; j++) {
		  enextself(neightet);
          if (!issubseg(neightet)) {
			if (j == 0) {
              senext(oldsh, searchsh);
            } else {
              senext2(oldsh, searchsh);
              sesymself(searchsh);
		      esymself(neightet);
            }
            // Calculate a lifted point. 
			pa = sorg(searchsh);
            pb = sdest(searchsh);
            pc = sapex(searchsh);
            pd = dest(neightet);
            calculateabovepoint4(pa, pb, pc, pd);
            // The lifted point must lie above 'searchsh'.
			ori = orient3d(pa, pb, pc, dummypoint);
			if (ori > 0) {
		      sesymself(searchsh);
		      senextself(searchsh);
		    } else if (ori == 0) {
		      terminatetetgen(this, 2);
		    }
			if (sscoutsegment(&searchsh,dest(neightet),0,0,1)==SHAREEDGE) {
              // Insert a temp segment to protect the recovered edge.
              face tmpseg;
              makeshellface(subsegs, &tmpseg);
              ssbond(searchsh, tmpseg);
              spivotself(searchsh);
              ssbond(searchsh, tmpseg);
              // Recover locally Delaunay edges.
              lawsonflip();
              // Delete the tmp segment.
              spivot(tmpseg, searchsh);
              ssdissolve(searchsh);
              spivotself(searchsh);
              ssdissolve(searchsh);
              shellfacedealloc(subsegs, tmpseg.sh);
			  searchflag = 1;
            } else {
              // Undo the performed flips.
              if (flipstack != NULL) {
                lawsonflip();
              }
            }
            break;
          } // if (!issubseg(neightet))
		} // j
        if (searchflag) break;
      } // if (pmarktested(apex(spintet)))
      fnextself(spintet);
      if (spintet.tet == searchtet.tet) break;
    }
  } // i

  if (searchflag) {
	// Remove faked segments.
    face checkseg;
    // Remark: We should not use the array 'missingshbds', since the flips may
    //   change the subfaces. We search them from the subfaces in R.
    for (i = 0; i < missingshs->objects; i++) {
      parysh = (face *) fastlookup(missingshs, i);
      oldsh = *parysh;
      for (j = 0; j < 3; j++) {
        if (isshsubseg(oldsh)) {
          sspivot(oldsh, checkseg);
          if (sinfected(checkseg)) {
            // It's a faked segment. Delete it.
            sstpivot1(checkseg, searchtet);
            spintet = searchtet;
            while (1) {
              tssdissolve1(spintet);
              fnextself(spintet);
              if (spintet.tet == searchtet.tet) break;
            }
            shellfacedealloc(subsegs, checkseg.sh);
            ssdissolve(oldsh);
          }
        }
        senextself(oldsh);
      } // j
    }

    fillregioncount++;

    return 0;
  } // if (i < missingshbds->objects)

  searchflag = 0;

  for (j = 0; j < missingshbds->objects && !searchflag; j++) {
    parysh = (face *) fastlookup(missingshbds, j);
    sspivot(*parysh, neighseg);
    sstpivot1(neighseg, searchtet);
    interflag = 0;
    // Let 'spintet' be [#,#,d,e] where [#,#] is the boundary edge of R.
    spintet = searchtet;
    while (1) {
      pd = apex(spintet);
      pe = oppo(spintet);
      // Skip a hull edge.
      if ((pd != dummypoint) && (pe != dummypoint)) {
        // Skip an edge containing a vertex of R.
        if (!pmarktested(pd) && !pmarktested(pe)) {
          // Check if [d,e] intersects R.
          for (i = 0; i < missingshs->objects && !interflag; i++) {
            parysh = (face *) fastlookup(missingshs, i);
            pa = sorg(*parysh);
            pb = sdest(*parysh);
            pc = sapex(*parysh);
            interflag=tri_edge_test(pa, pb, pc, pd, pe, NULL, 1, types, poss);
            if (interflag > 0) { 
              if (interflag == 2) {
                // They intersect at a single point.
				if ((types[0] == (int) ACROSSFACE) ||
				    (types[0] == (int) ACROSSEDGE)) {
                  // Go to the crossing edge [d,e,#,#].
                  edestoppo(spintet, crosstet); // // [d,e,#,#].
                  if (issubseg(crosstet)) {
				    // It is a segment. Report a PLC problem.
				    report_selfint_face(pa, pb, pc, parysh, &crosstet, 
					                    interflag, types, poss);
                  } else {
				    triface chkface = crosstet;
					while (1) {
					  if (issubface(chkface)) break;
					  fsymself(chkface);
					  if (chkface.tet == crosstet.tet) break;
					}
					if (issubface(chkface)) {
					  // Two subfaces are intersecting.
                      report_selfint_face(pa, pb, pc, parysh, &chkface, 
					                    interflag, types, poss);
					}
				  }
                  // Adjust the edge such that d lies below [a,b,c].
                  ori = orient3d(pa, pb, pc, pd);
                  if (ori < 0) {
                    esymself(crosstet);
                  }
                  searchflag = 1;                  
                } else {
                  // An improper intersection type, ACROSSVERT, TOUCHFACE,
				  //   TOUCHEDGE, SHAREVERT, ...
                  // Maybe it is due to a PLC problem.
				  report_selfint_face(pa, pb, pc, parysh, &crosstet, 
					                  interflag, types, poss);
                }
              }
              break;
            } // if (interflag > 0)
          }
        } 
      }
      // Leave search at this bdry edge if an intersection is found.
      if (interflag > 0) break;
      // Go to the next tetrahedron.
      fnextself(spintet);
      if (spintet.tet == searchtet.tet) break; 
    } // while (1)
  } // j

  return searchflag;
}